

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_dlib.cpp
# Opt level: O2

void dlib::cpu::ttimpl::softmax_gradient
               (long num_locations,long num_channels,tensor *grad,tensor *dest,
               tensor *gradient_input,operation_mode mode)

{
  uint *puVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar6;
  long lVar7;
  ostream *poVar8;
  fatal_error *pfVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long i;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  float sum;
  undefined1 auVar25 [16];
  long local_210;
  long local_208;
  string local_1c8;
  ostringstream dlib_o_out;
  uint auStack_190 [88];
  
  bVar4 = have_same_dimensions(grad,dest);
  if (!bVar4) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dlib_o_out);
    poVar8 = std::operator<<((ostream *)&dlib_o_out,"\n\nError detected at line ");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x6aa);
    std::operator<<(poVar8,".\n");
    poVar8 = std::operator<<((ostream *)&dlib_o_out,"Error detected in file ");
    poVar8 = std::operator<<(poVar8,
                             "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp"
                            );
    std::operator<<(poVar8,".\n");
    poVar8 = std::operator<<((ostream *)&dlib_o_out,"Error detected in function ");
    poVar8 = std::operator<<(poVar8,
                             "void dlib::cpu::ttimpl::softmax_gradient(const long, const long, tensor &, const tensor &, const tensor &, operation_mode)"
                            );
    std::operator<<(poVar8,".\n\n");
    poVar8 = std::operator<<((ostream *)&dlib_o_out,"Failing expression was ");
    poVar8 = std::operator<<(poVar8,"have_same_dimensions(grad, dest)");
    std::operator<<(poVar8,".\n");
    puVar1 = (uint *)((long)auStack_190 + *(long *)(_dlib_o_out + -0x18));
    *puVar1 = *puVar1 | 1;
    poVar8 = std::operator<<((ostream *)&dlib_o_out,"");
    std::operator<<(poVar8,"\n");
    pfVar9 = (fatal_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::stringbuf::str();
    fatal_error::fatal_error(pfVar9,EBROKEN_ASSERT,&local_1c8);
    __cxa_throw(pfVar9,&fatal_error::typeinfo,error::~error);
  }
  bVar4 = have_same_dimensions(grad,gradient_input);
  if (bVar4) {
    iVar5 = (*dest->_vptr_tensor[2])(dest);
    local_208 = CONCAT44(extraout_var,iVar5);
    iVar5 = (*grad->_vptr_tensor[3])(grad);
    local_210 = CONCAT44(extraout_var_00,iVar5);
    iVar5 = (*gradient_input->_vptr_tensor[2])(gradient_input);
    lVar7 = CONCAT44(extraout_var_01,iVar5);
    uVar2 = grad->m_n;
    uVar21 = ~(num_channels >> 0x3f) & num_channels;
    lVar24 = num_locations * 4;
    lVar23 = num_channels * num_locations * 4;
    for (uVar13 = 0; uVar13 != (~((long)uVar2 >> 0x3f) & uVar2); uVar13 = uVar13 + 1) {
      if (mode == PLANE_WISE) {
        uVar19 = grad->m_nr;
        lVar16 = lVar7;
        lVar17 = local_208;
        lVar18 = local_210;
        for (uVar11 = 0; uVar11 != uVar21; uVar11 = uVar11 + 1) {
          uVar12 = grad->m_nc;
          uVar14 = ~((long)uVar12 >> 0x3f) & uVar12;
          lVar15 = uVar12 * 4;
          lVar6 = lVar18;
          lVar20 = lVar17;
          lVar22 = lVar16;
          for (uVar12 = 0; uVar12 != (~((long)uVar19 >> 0x3f) & uVar19); uVar12 = uVar12 + 1) {
            auVar25 = ZEXT816(0) << 0x40;
            for (uVar10 = 0; uVar14 != uVar10; uVar10 = uVar10 + 1) {
              auVar25 = vfnmadd231ss_fma(auVar25,ZEXT416(*(uint *)(lVar20 + uVar10 * 4)),
                                         ZEXT416(*(uint *)(lVar22 + uVar10 * 4)));
            }
            uVar10 = 0;
            if (gradient_input == grad) {
              for (; uVar14 != uVar10; uVar10 = uVar10 + 1) {
                *(float *)(lVar6 + uVar10 * 4) =
                     (auVar25._0_4_ + *(float *)(lVar22 + uVar10 * 4)) *
                     *(float *)(lVar20 + uVar10 * 4);
              }
            }
            else {
              for (; uVar14 != uVar10; uVar10 = uVar10 + 1) {
                auVar3 = vfmadd213ss_fma(ZEXT416((uint)(auVar25._0_4_ +
                                                       *(float *)(lVar22 + uVar10 * 4))),
                                         ZEXT416(*(uint *)(lVar20 + uVar10 * 4)),
                                         ZEXT416(*(uint *)(lVar6 + uVar10 * 4)));
                *(int *)(lVar6 + uVar10 * 4) = auVar3._0_4_;
              }
            }
            lVar22 = lVar22 + lVar15;
            lVar20 = lVar20 + lVar15;
            lVar6 = lVar6 + lVar15;
          }
          lVar16 = lVar16 + lVar24;
          lVar17 = lVar17 + lVar24;
          lVar18 = lVar18 + lVar24;
        }
      }
      else if (mode == CHANNEL_WISE) {
        lVar16 = local_210;
        lVar17 = local_208;
        lVar18 = lVar7;
        for (uVar19 = 0; uVar19 != (~(num_locations >> 0x3f) & num_locations); uVar19 = uVar19 + 1)
        {
          auVar25 = ZEXT816(0) << 0x40;
          lVar6 = 0;
          uVar11 = uVar21;
          while( true ) {
            bVar4 = uVar11 == 0;
            uVar11 = uVar11 - 1;
            if (bVar4) break;
            auVar25 = vfnmadd231ss_fma(auVar25,ZEXT416(*(uint *)(lVar17 + lVar6)),
                                       ZEXT416(*(uint *)(lVar18 + lVar6)));
            lVar6 = lVar6 + lVar24;
          }
          lVar6 = 0;
          uVar11 = uVar21;
          if (gradient_input == grad) {
            while (bVar4 = uVar11 != 0, uVar11 = uVar11 - 1, bVar4) {
              *(float *)(lVar16 + lVar6) =
                   (auVar25._0_4_ + *(float *)(lVar18 + lVar6)) * *(float *)(lVar17 + lVar6);
              lVar6 = lVar6 + lVar24;
            }
          }
          else {
            while (bVar4 = uVar11 != 0, uVar11 = uVar11 - 1, bVar4) {
              auVar3 = vfmadd213ss_fma(ZEXT416((uint)(auVar25._0_4_ + *(float *)(lVar18 + lVar6))),
                                       ZEXT416(*(uint *)(lVar17 + lVar6)),
                                       ZEXT416(*(uint *)(lVar16 + lVar6)));
              *(int *)(lVar16 + lVar6) = auVar3._0_4_;
              lVar6 = lVar6 + lVar24;
            }
          }
          lVar18 = lVar18 + 4;
          lVar17 = lVar17 + 4;
          lVar16 = lVar16 + 4;
        }
      }
      local_208 = local_208 + lVar23;
      local_210 = local_210 + lVar23;
      lVar7 = lVar7 + lVar23;
    }
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&dlib_o_out);
  poVar8 = std::operator<<((ostream *)&dlib_o_out,"\n\nError detected at line ");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x6ab);
  std::operator<<(poVar8,".\n");
  poVar8 = std::operator<<((ostream *)&dlib_o_out,"Error detected in file ");
  poVar8 = std::operator<<(poVar8,
                           "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp"
                          );
  std::operator<<(poVar8,".\n");
  poVar8 = std::operator<<((ostream *)&dlib_o_out,"Error detected in function ");
  poVar8 = std::operator<<(poVar8,
                           "void dlib::cpu::ttimpl::softmax_gradient(const long, const long, tensor &, const tensor &, const tensor &, operation_mode)"
                          );
  std::operator<<(poVar8,".\n\n");
  poVar8 = std::operator<<((ostream *)&dlib_o_out,"Failing expression was ");
  poVar8 = std::operator<<(poVar8,"have_same_dimensions(grad, gradient_input)");
  std::operator<<(poVar8,".\n");
  puVar1 = (uint *)((long)auStack_190 + *(long *)(_dlib_o_out + -0x18));
  *puVar1 = *puVar1 | 1;
  poVar8 = std::operator<<((ostream *)&dlib_o_out,"");
  std::operator<<(poVar8,"\n");
  pfVar9 = (fatal_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::stringbuf::str();
  fatal_error::fatal_error(pfVar9,EBROKEN_ASSERT,&local_1c8);
  __cxa_throw(pfVar9,&fatal_error::typeinfo,error::~error);
}

Assistant:

void softmax_gradient(
                const long num_locations,
                const long num_channels,
                tensor& grad,
                const tensor& dest,
                const tensor& gradient_input,
                operation_mode mode = operation_mode::CHANNEL_WISE
            )
            {
                DLIB_ASSERT(num_channels * num_locations == grad.nr() * grad.nc() * grad.k());
                DLIB_CASSERT(have_same_dimensions(grad, dest));
                DLIB_CASSERT(have_same_dimensions(grad, gradient_input));

                const auto d = dest.host();
                const auto g = grad.host();
                const auto in = gradient_input.host();
                for (long n = 0; n < grad.num_samples(); ++n)
                {
                    const auto d2 = d + num_locations * num_channels * n;
                    const auto g2 = g + num_locations * num_channels * n;
                    const auto in2 = in + num_locations * num_channels * n;

                    if (mode == operation_mode::CHANNEL_WISE)
                    {
                        for (long i = 0; i < num_locations; ++i)
                        {
                            const auto d3 = d2 + i;
                            const auto g3 = g2 + i;
                            const auto in3 = in2 + i;
                            float sum = 0.0f;
                            for (long k = 0; k < num_channels; ++k)
                                sum += -d3[k * num_locations] * in3[k * num_locations];
                            if (is_same_object(gradient_input, grad))
                            {
                                for (long k = 0; k < num_channels; ++k)
                                    g3[k * num_locations] = d3[k * num_locations] * (sum + in3[k * num_locations]);
                            }
                            else
                            {
                                for (long k = 0; k < num_channels; ++k)
                                    g3[k * num_locations] += d3[k * num_locations] * (sum + in3[k * num_locations]);
                            }
                        }
                    }
                    else if (mode == operation_mode::PLANE_WISE)
                    {
                        for (long k = 0; k < num_channels; ++k)
                        {
                            const auto d_channel = d2 + k * num_locations;
                            const auto g_channel = g2 + k * num_locations;
                            const auto in_channel = in2 + k * num_locations;
                            for (long r = 0; r < grad.nr(); ++r)
                            {
                                float sum = 0.0f;
                                for (long c = 0, idx = r * grad.nc(); c < grad.nc(); ++c, ++idx)
                                    sum += -d_channel[idx] * in_channel[idx];
                                if (is_same_object(gradient_input, grad))
                                {
                                    for (long c = 0, idx = r * grad.nc(); c < grad.nc(); ++c, ++idx)
                                        g_channel[idx] = d_channel[idx] * (sum + in_channel[idx]);
                                }
                                else
                                {
                                    for (long c = 0, idx = r * grad.nc(); c < grad.nc(); ++c, ++idx)
                                        g_channel[idx] += d_channel[idx] * (sum + in_channel[idx]);
                                }
                            }
                        }
                    }
                }
            }